

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O0

Mvc_Cover_t * Mvc_CoverTranspose(Mvc_Cover_t *pCover)

{
  Mvc_Manager_t *pMem;
  int nBits;
  Mvc_Cover_t *pCover_00;
  Mvc_Cube_t *pMVar1;
  Mvc_List_t *pList;
  int local_38;
  int _i_;
  int iCube;
  int i;
  int nBit;
  int nWord;
  Mvc_Cube_t *pCube;
  Mvc_Cube_t *pCubeRes;
  Mvc_Cover_t *pRes;
  Mvc_Cover_t *pCover_local;
  
  pMem = pCover->pMem;
  nBits = Mvc_CoverReadCubeNum(pCover);
  pCover_00 = Mvc_CoverAlloc(pMem,nBits);
  for (_i_ = 0; _i_ < pCover->nBits; _i_ = _i_ + 1) {
    pMVar1 = Mvc_CubeAlloc(pCover_00);
    if ((*(uint *)&pMVar1->field_0x8 & 0xffffff) == 0) {
      pMVar1->pData[0] = 0;
    }
    else if ((*(uint *)&pMVar1->field_0x8 & 0xffffff) == 1) {
      pMVar1->pData[0] = 0;
      *(undefined4 *)&pMVar1->field_0x14 = 0;
    }
    else {
      for (pList._4_4_ = *(uint *)&pMVar1->field_0x8 & 0xffffff; -1 < (int)pList._4_4_;
          pList._4_4_ = pList._4_4_ - 1) {
        pMVar1->pData[(int)pList._4_4_] = 0;
      }
    }
    local_38 = 0;
    for (_nBit = (pCover->lCubes).pHead; _nBit != (Mvc_Cube_t *)0x0; _nBit = _nBit->pNext) {
      if ((_nBit->pData[_i_ >> 5] & 1 << ((byte)_i_ & 0x1f)) != 0) {
        pMVar1->pData[local_38 >> 5] = 1 << ((byte)local_38 & 0x1f) | pMVar1->pData[local_38 >> 5];
      }
      local_38 = local_38 + 1;
    }
    if ((pCover_00->lCubes).pHead == (Mvc_Cube_t *)0x0) {
      (pCover_00->lCubes).pHead = pMVar1;
    }
    else {
      ((pCover_00->lCubes).pTail)->pNext = pMVar1;
    }
    (pCover_00->lCubes).pTail = pMVar1;
    pMVar1->pNext = (Mvc_Cube_t *)0x0;
    (pCover_00->lCubes).nItems = (pCover_00->lCubes).nItems + 1;
  }
  return pCover_00;
}

Assistant:

Mvc_Cover_t * Mvc_CoverTranspose( Mvc_Cover_t * pCover )
{
    Mvc_Cover_t * pRes;
    Mvc_Cube_t * pCubeRes, * pCube;
    int nWord, nBit, i, iCube;

    pRes = Mvc_CoverAlloc( pCover->pMem, Mvc_CoverReadCubeNum(pCover) );
    for ( i = 0; i < pCover->nBits; i++ )
    {
        // get the word and bit of this literal
        nWord = Mvc_CubeWhichWord(i);
        nBit  = Mvc_CubeWhichBit(i);
        // get the transposed cube
        pCubeRes = Mvc_CubeAlloc( pRes );
        Mvc_CubeBitClean( pCubeRes );
        iCube = 0;
        Mvc_CoverForEachCube( pCover, pCube )
        {
            if ( pCube->pData[nWord] & (1<<nBit) )
                Mvc_CubeBitInsert( pCubeRes, iCube );
            iCube++;
        }
        Mvc_CoverAddCubeTail( pRes, pCubeRes ); 
    }
    return pRes;
}